

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

uint baryonyx::numeric_cast<unsigned_int,unsigned_long>(unsigned_long s)

{
  numeric_cast_failure *this;
  
  if (s >> 0x20 == 0) {
    return (uint)s;
  }
  this = (numeric_cast_failure *)__cxa_allocate_exception(0x10);
  numeric_cast_failure::numeric_cast_failure(this);
  __cxa_throw(this,&numeric_cast_failure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline bool
is_numeric_castable(Source arg) noexcept
{
    static_assert(std::is_integral<Source>::value, "Integer required.");
    static_assert(std::is_integral<Target>::value, "Integer required.");

    using arg_traits = std::numeric_limits<Source>;
    using result_traits = std::numeric_limits<Target>;

    if (result_traits::digits == arg_traits::digits &&
        result_traits::is_signed == arg_traits::is_signed)
        return true;

    if (result_traits::digits > arg_traits::digits)
        return result_traits::is_signed || arg >= 0;

    if (arg_traits::is_signed &&
        arg < static_cast<Source>(result_traits::min()))
        return false;

    return arg <= static_cast<Source>(result_traits::max());
}